

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O2

MPP_RET h264e_vepu_mbrc_prepare(HalH264eVepuMbRcCtx ctx,HalH264eVepuMbRc *mbrc,EncRcTask *rc_task)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RK_S32 RVar3;
  uint uVar4;
  RK_S32 RVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  
  uVar10 = *(int *)((long)ctx + 0x14) * 0x180;
  mbrc->qp_init = (rc_task->info).quality_target;
  uVar1 = (rc_task->info).quality_max;
  uVar2 = (rc_task->info).quality_min;
  mbrc->qp_min = uVar2;
  mbrc->qp_max = uVar1;
  mbrc->mad_qp_change = 0;
  mbrc->mad_threshold = 0;
  mbrc->cp_distance_mbs = 0;
  if (*(int *)((long)ctx + 0x1c) != 0) {
    *(undefined4 *)((long)ctx + 0x54) = *(undefined4 *)((long)ctx + 0x50);
    *(uint *)((long)ctx + 0x50) = *(uint *)&rc_task->frm >> 3 & 2;
    iVar6 = mbrc->rlc_count;
    if (iVar6 == 0) {
      mbrc->rlc_count = 1;
      iVar6 = 1;
    }
    RVar3 = axb_div_c(mbrc->out_strm_size << 3,0x100,iVar6);
    if (RVar3 != 0 && ((ulong)rc_task->frm & 0x10) == 0) {
      uVar4 = axb_div_c((rc_task->info).bit_target,0x100,RVar3);
      uVar7 = 0;
      if (0 < (int)uVar4) {
        uVar7 = uVar4;
      }
      if ((int)uVar10 < (int)uVar7) {
        uVar7 = uVar10;
      }
      if (uVar7 != 0) {
        uVar10 = 0x1fffff;
        if (uVar7 < 0x1fffff) {
          uVar10 = uVar7;
        }
        RVar5 = axb_div_c(uVar10,0x100,*(RK_S32 *)((long)ctx + 0x14));
        if ((*(int *)((long)ctx + 0x50) == *(int *)((long)ctx + 0x54)) && (mbrc->rlc_count != 0)) {
          for (lVar9 = 0; lVar9 != 10; lVar9 = lVar9 + 1) {
            iVar8 = mbrc->cp_usage[lVar9] * RVar5;
            iVar6 = 0xffff;
            if ((iVar8 < 0x1fffc000) && (iVar6 = iVar8 / 0x2000 + 1, iVar8 < -0x3fff)) {
              iVar6 = 0xffff;
            }
            mbrc->cp_target[lVar9] = iVar6;
          }
        }
        else {
          for (lVar9 = 4; lVar9 != 0xe; lVar9 = lVar9 + 1) {
            iVar8 = (((int)lVar9 + -3) * *(int *)((long)ctx + 0x48) + 1) * RVar5;
            iVar6 = 0xffff;
            if ((iVar8 < 0x1fffc000) && (iVar6 = iVar8 / 0x2000 + 1, iVar8 < -0x3fff)) {
              iVar6 = 0xffff;
            }
            mbrc->cp_target[lVar9 + -4] = iVar6;
          }
        }
        RVar3 = axb_div_c(*(RK_S32 *)((long)ctx + 0x18),0x100,RVar3);
        mbrc->cp_error[0] = RVar3 * -3;
        mbrc->cp_error[1] = RVar3 * -2;
        mbrc->cp_error[2] = -RVar3;
        mbrc->cp_error[3] = RVar3;
        mbrc->cp_delta_qp[0] = 3;
        mbrc->cp_delta_qp[1] = 2;
        mbrc->cp_delta_qp[2] = 1;
        mbrc->cp_delta_qp[3] = 0;
        mbrc->cp_error[4] = RVar3 * 2;
        mbrc->cp_delta_qp[4] = -1;
        mbrc->cp_error[5] = RVar3 * 3;
        mbrc->cp_delta_qp[5] = -2;
        mbrc->cp_delta_qp[6] = -3;
        mbrc->cp_error[6] = RVar3 << 2;
        for (lVar9 = 0; lVar9 != 7; lVar9 = lVar9 + 1) {
          iVar6 = mbrc->cp_error[lVar9] / 4;
          if (0x7ffe < iVar6) {
            iVar6 = 0x7fff;
          }
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          mbrc->cp_error[lVar9] = iVar6;
        }
        mbrc->cp_distance_mbs = *(RK_S32 *)((long)ctx + 0x48);
      }
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_mbrc_prepare(HalH264eVepuMbRcCtx ctx, HalH264eVepuMbRc *mbrc,
                                EncRcTask *rc_task)
{
    HalH264eVepuMbRcImpl *p = (HalH264eVepuMbRcImpl *)ctx;
    EncFrmStatus *frm = &rc_task->frm;
    EncRcTaskInfo *info = &rc_task->info;

    RK_S32 i;
    const RK_S32 sscale = 256;
    RK_S32 scaler, srcPrm;
    RK_S32 tmp, nonZeroTarget;
    RK_S32 coeffCntMax = p->mbs * 24 * 16;

    mbrc->qp_init = info->quality_target;
    mbrc->qp_min = info->quality_min;
    mbrc->qp_max = info->quality_max;
    mbrc->mad_qp_change = 0;
    mbrc->mad_threshold = 0;
    mbrc->cp_distance_mbs = 0;

    if (!p->mb_bit_rc_enable)
        return MPP_OK;

    p->pre_frame_type = p->frame_type;
    p->frame_type = (frm->is_intra) ? INTRA_FRAME : INTER_P_FRAME;

    if (mbrc->rlc_count == 0) {
        mbrc->rlc_count = 1;
    }

    srcPrm = axb_div_c(mbrc->out_strm_size * 8, 256, mbrc->rlc_count);
    /* Disable Mb Rc for Intra Slices, because coeffTarget will be wrong */
    if (frm->is_intra || srcPrm == 0)
        return 0;

    /* Required zero cnt */
    nonZeroTarget = axb_div_c(info->bit_target, 256, srcPrm);
    nonZeroTarget = MPP_MIN(coeffCntMax, MPP_MAX(0, nonZeroTarget));
    nonZeroTarget = MPP_MIN(0x7FFFFFFFU / 1024U, (RK_U32)nonZeroTarget);

    if (nonZeroTarget > 0) {
        scaler = axb_div_c(nonZeroTarget, sscale, (RK_S32) p->mbs);
    } else {
        return 0;
    }

    if ((p->frame_type != p->pre_frame_type) || (mbrc->rlc_count == 0)) {
        for (i = 0; i < VEPU_CHECK_POINTS_MAX; i++) {
            tmp = (scaler * (p->check_point_distance * (i + 1) + 1)) / sscale;
            tmp = MPP_MIN(WORD_CNT_MAX, tmp / 32 + 1);
            if (tmp < 0) tmp = WORD_CNT_MAX;    /* Detect overflow */
            mbrc->cp_target[i] = tmp; /* div32 for regs */
        }

        tmp = axb_div_c(p->bits_per_pic, 256, srcPrm);
    } else {
        for (i = 0; i < VEPU_CHECK_POINTS_MAX; i++) {
            tmp = (RK_S32) (mbrc->cp_usage[i] * scaler) / sscale;
            tmp = MPP_MIN(WORD_CNT_MAX, tmp / 32 + 1);
            if (tmp < 0) tmp = WORD_CNT_MAX;    /* Detect overflow */
            mbrc->cp_target[i] = tmp; /* div32 for regs */
        }
        tmp = axb_div_c(p->bits_per_pic, 256, srcPrm);
    }

    mbrc->cp_error[0] = -tmp * 3;
    mbrc->cp_delta_qp[0] = 3;
    mbrc->cp_error[1] = -tmp * 2;
    mbrc->cp_delta_qp[1] = 2;
    mbrc->cp_error[2] = -tmp * 1;
    mbrc->cp_delta_qp[2] = 1;
    mbrc->cp_error[3] = tmp * 1;
    mbrc->cp_delta_qp[3] = 0;
    mbrc->cp_error[4] = tmp * 2;
    mbrc->cp_delta_qp[4] = -1;
    mbrc->cp_error[5] = tmp * 3;
    mbrc->cp_delta_qp[5] = -2;
    mbrc->cp_error[6] = tmp * 4;
    mbrc->cp_delta_qp[6] = -3;

    for (i = 0; i < VEPU_CTRL_LEVELS; i++) {
        tmp = mbrc->cp_error[i];
        tmp = mpp_clip(tmp / 4, -32768, 32767);
        mbrc->cp_error[i] = tmp;
    }

    mbrc->cp_distance_mbs = p->check_point_distance;

    return MPP_OK;
}